

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mime.c
# Opt level: O3

size_t readback_part(curl_mimepart *part,char *buffer,size_t bufsize)

{
  void **ppvVar1;
  char *__dest;
  size_t *psVar2;
  mimestate mVar3;
  char *pcVar4;
  size_t sVar5;
  size_t sVar6;
  curl_slist *pcVar7;
  bool bVar8;
  size_t sVar9;
  ulong uVar10;
  ulong uVar11;
  size_t __n;
  bool bVar12;
  size_t local_58;
  char *local_50;
  
  if (bufsize == 0) {
    sVar9 = 0;
  }
  else {
    ppvVar1 = &(part->state).ptr;
    __dest = (part->encstate).buf;
    sVar9 = 0;
    do {
      mVar3 = (part->state).state;
      __n = 0;
      if (MIMESTATE_END < mVar3) goto switchD_0013c353_caseD_5;
      pcVar7 = (curl_slist *)(part->state).ptr;
      switch(mVar3) {
      case MIMESTATE_BEGIN:
        pcVar7 = part->curlheaders;
        (part->state).state = ((part->flags & 2) >> 1) * 3 + MIMESTATE_CURLHEADERS;
        (part->state).ptr = pcVar7;
        goto LAB_0013c636;
      case MIMESTATE_CURLHEADERS:
        if (pcVar7 == (curl_slist *)0x0) {
          pcVar7 = part->userheaders;
LAB_0013c624:
          (part->state).state = MIMESTATE_USERHEADERS;
        }
        else {
LAB_0013c41b:
          pcVar4 = pcVar7->data;
          sVar5 = strlen(pcVar4);
          uVar10 = (part->state).offset;
          uVar11 = uVar10 - sVar5;
          if (uVar10 < sVar5) {
            uVar11 = sVar5 - uVar10;
            pcVar4 = pcVar4 + uVar10;
LAB_0013c5dd:
            __n = bufsize;
            if (uVar11 < bufsize) {
              __n = uVar11;
            }
            memcpy(buffer,pcVar4,__n);
            psVar2 = &(part->state).offset;
            *psVar2 = *psVar2 + __n;
            if (uVar11 != 0) break;
          }
          else if (uVar11 < 2) {
            pcVar4 = "Content-Length: 0\r\n\r\n" + uVar11 + 0x13;
            uVar11 = 2 - uVar11;
            goto LAB_0013c5dd;
          }
          pcVar7 = pcVar7->next;
        }
        (part->state).ptr = pcVar7;
LAB_0013c636:
        (part->state).offset = 0;
LAB_0013c641:
        __n = 0;
        break;
      case MIMESTATE_USERHEADERS:
        if (pcVar7 != (curl_slist *)0x0) {
          pcVar4 = match_header(pcVar7,"Content-Type",0xc);
          if (pcVar4 != (char *)0x0) {
            pcVar7 = pcVar7->next;
            goto LAB_0013c624;
          }
          goto LAB_0013c41b;
        }
        (part->state).state = MIMESTATE_EOH;
        goto LAB_0013c61b;
      case MIMESTATE_EOH:
        uVar10 = (part->state).offset;
        if (1 < uVar10) {
          (part->state).state = MIMESTATE_BODY;
          goto LAB_0013c61b;
        }
        __n = 2 - uVar10;
        if (bufsize <= 2 - uVar10) {
          __n = bufsize;
        }
        memcpy(buffer,"Content-Length: 0\r\n\r\n" + uVar10 + 0x13,__n);
        psVar2 = &(part->state).offset;
        *psVar2 = *psVar2 + __n;
        break;
      case MIMESTATE_BODY:
        (part->encstate).pos = 0;
        (part->encstate).bufbeg = 0;
        (part->encstate).bufend = 0;
        (part->state).state = MIMESTATE_CONTENT;
LAB_0013c61b:
        *ppvVar1 = (void *)0x0;
        (part->state).offset = 0;
        goto LAB_0013c641;
      case MIMESTATE_CONTENT:
        if (part->encoder != (mime_encoder *)0x0) {
          __n = 0;
          local_58 = bufsize;
          local_50 = buffer;
          bVar12 = false;
LAB_0013c47b:
          do {
            while( true ) {
              bVar8 = bVar12;
              uVar10 = (part->encstate).bufbeg;
              uVar11 = (part->encstate).bufend;
              bVar12 = uVar11 <= uVar10;
              if (bVar12 && !bVar8) break;
              sVar6 = (*part->encoder->encodefunc)(local_50,local_58,(_Bool)(bVar12 | bVar8),part);
              if (sVar6 == 0) {
                if (!bVar12 && !bVar8) {
                  uVar10 = (part->encstate).bufbeg;
                  uVar11 = (part->encstate).bufend;
                  break;
                }
                goto LAB_0013c692;
              }
              if ((sVar6 - 0x10000000 < 2) || (sVar6 == 0xffffffffffffffff)) {
                if (__n == 0) {
                  __n = sVar6;
                }
                goto LAB_0013c692;
              }
              __n = __n + sVar6;
              local_50 = local_50 + sVar6;
              local_58 = local_58 - sVar6;
              bVar12 = bVar8;
              if (local_58 == 0) goto LAB_0013c692;
            }
            if (uVar10 != 0) {
              uVar11 = uVar11 - uVar10;
              if (uVar11 != 0) {
                memmove(__dest,__dest + uVar10,uVar11);
              }
              (part->encstate).bufbeg = 0;
              (part->encstate).bufend = uVar11;
            }
            if (0xff < uVar11) {
              if (__n == 0) {
                __n = 0xffffffffffffffff;
                goto LAB_0013c6e0;
              }
              goto LAB_0013c692;
            }
            bVar12 = true;
          } while (part->readfunc == (curl_read_callback)0x0);
          sVar6 = (*part->readfunc)(__dest + uVar11,1,0x100 - uVar11,part->arg);
          if (1 < sVar6 - 0x10000000) {
            if (sVar6 == 0) goto LAB_0013c47b;
            if (sVar6 != 0xffffffffffffffff) {
              psVar2 = &(part->encstate).bufend;
              *psVar2 = *psVar2 + sVar6;
              bVar12 = bVar8;
              goto LAB_0013c47b;
            }
          }
          if (__n == 0) {
            __n = sVar6;
          }
          goto LAB_0013c692;
        }
        if (part->readfunc == (curl_read_callback)0x0) {
LAB_0013c6aa:
          (part->state).state = MIMESTATE_END;
          *ppvVar1 = (void *)0x0;
          (part->state).offset = 0;
          if ((part->kind == MIMEKIND_FILE) && ((FILE *)part->fp != (FILE *)0x0)) {
            fclose((FILE *)part->fp);
            part->fp = (FILE *)0x0;
          }
          __n = 0;
        }
        else {
          __n = (*part->readfunc)(buffer,1,bufsize,part->arg);
LAB_0013c692:
          if ((1 < __n - 0x10000000) && (__n != 0xffffffffffffffff)) {
            if (__n != 0) break;
            goto LAB_0013c6aa;
          }
        }
LAB_0013c6e0:
        if (sVar9 == 0) {
          sVar9 = __n;
        }
      case MIMESTATE_END:
        goto switchD_0013c353_caseD_8;
      }
switchD_0013c353_caseD_5:
      sVar9 = sVar9 + __n;
      buffer = buffer + __n;
      bufsize = bufsize - __n;
    } while (bufsize != 0);
  }
switchD_0013c353_caseD_8:
  return sVar9;
}

Assistant:

static size_t readback_part(curl_mimepart *part,
                            char *buffer, size_t bufsize)
{
  size_t cursize = 0;
#ifdef CURL_DOES_CONVERSIONS
  char *convbuf = buffer;
#endif

  /* Readback from part. */

  while(bufsize) {
    size_t sz = 0;
    struct curl_slist *hdr = (struct curl_slist *) part->state.ptr;
    switch(part->state.state) {
    case MIMESTATE_BEGIN:
      mimesetstate(&part->state,
                   (part->flags & MIME_BODY_ONLY)?
                     MIMESTATE_BODY: MIMESTATE_CURLHEADERS,
                   part->curlheaders);
      break;
    case MIMESTATE_USERHEADERS:
      if(!hdr) {
        mimesetstate(&part->state, MIMESTATE_EOH, NULL);
        break;
      }
      if(match_header(hdr, "Content-Type", 12)) {
        mimesetstate(&part->state, MIMESTATE_USERHEADERS, hdr->next);
        break;
      }
      /* FALLTHROUGH */
    case MIMESTATE_CURLHEADERS:
      if(!hdr)
        mimesetstate(&part->state, MIMESTATE_USERHEADERS, part->userheaders);
      else {
        sz = readback_bytes(&part->state, buffer, bufsize,
                            hdr->data, strlen(hdr->data), "\r\n");
        if(!sz)
          mimesetstate(&part->state, part->state.state, hdr->next);
      }
      break;
    case MIMESTATE_EOH:
      sz = readback_bytes(&part->state, buffer, bufsize, "\r\n", 2, "");
      if(!sz)
        mimesetstate(&part->state, MIMESTATE_BODY, NULL);
      break;
    case MIMESTATE_BODY:
#ifdef CURL_DOES_CONVERSIONS
      if(part->easy && convbuf < buffer) {
        CURLcode result = Curl_convert_to_network(part->easy, convbuf,
                                                  buffer - convbuf);
        if(result)
          return READ_ERROR;
        convbuf = buffer;
      }
#endif
      cleanup_encoder_state(&part->encstate);
      mimesetstate(&part->state, MIMESTATE_CONTENT, NULL);
      break;
    case MIMESTATE_CONTENT:
      if(part->encoder)
        sz = read_encoded_part_content(part, buffer, bufsize);
      else
        sz = read_part_content(part, buffer, bufsize);
      switch(sz) {
      case 0:
        mimesetstate(&part->state, MIMESTATE_END, NULL);
        /* Try sparing open file descriptors. */
        if(part->kind == MIMEKIND_FILE && part->fp) {
          fclose(part->fp);
          part->fp = NULL;
        }
        /* FALLTHROUGH */
      case CURL_READFUNC_ABORT:
      case CURL_READFUNC_PAUSE:
      case READ_ERROR:
        return cursize? cursize: sz;
      }
      break;
    case MIMESTATE_END:
      return cursize;
    default:
      break;    /* Other values not in part state. */
    }

    /* Bump buffer and counters according to read size. */
    cursize += sz;
    buffer += sz;
    bufsize -= sz;
  }

#ifdef CURL_DOES_CONVERSIONS
      if(part->easy && convbuf < buffer &&
         part->state.state < MIMESTATE_BODY) {
        CURLcode result = Curl_convert_to_network(part->easy, convbuf,
                                                  buffer - convbuf);
        if(result)
          return READ_ERROR;
      }
#endif

  return cursize;
}